

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.hpp
# Opt level: O3

String * Diligent::GetObjectDescString<Diligent::TextureDesc>
                   (String *__return_storage_ptr__,TextureDesc *TexDesc)

{
  TextureDesc *Desc;
  String local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Tex desc: ","");
  GetTextureDescString_abi_cxx11_(&local_38,(Diligent *)TexDesc,Desc);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String GetObjectDescString(const TextureDesc& TexDesc)
{
    String Str{"Tex desc: "};
    Str += GetTextureDescString(TexDesc);
    return Str;
}